

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
int_writer<unsigned_int,_fmt::v5::basic_format_specs<char>_>::on_oct
          (int_writer<unsigned_int,_fmt::v5::basic_format_specs<char>_> *this)

{
  basic_format_specs<char> *spec;
  uint uVar1;
  uint num_digits;
  uint uVar2;
  bin_writer<3> bVar3;
  bin_writer<3> f;
  string_view prefix;
  
  uVar1 = this->abs_value;
  bVar3.num_digits = 0;
  bVar3.abs_value = uVar1;
  num_digits = 0;
  f = bVar3;
  do {
    f = (bin_writer<3>)((long)f + 0x100000000);
    num_digits = num_digits + 1;
    uVar1 = uVar1 >> 3;
    uVar2 = bVar3.abs_value;
    bVar3.num_digits = 0;
    bVar3.abs_value = uVar1;
  } while (7 < uVar2);
  spec = this->spec;
  if (((spec->flags_ & 8) != 0) && (spec->precision_ <= (int)num_digits)) {
    uVar1 = this->prefix_size;
    this->prefix_size = uVar1 + 1;
    this->prefix[uVar1] = '0';
  }
  prefix.data_ = this->prefix;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.size_._4_4_ = 0;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
  write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
            ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *)
             this->writer,num_digits,prefix,spec,f);
  return;
}

Assistant:

void on_oct() {
      unsigned num_digits = count_digits<3>();
      if (spec.flag(HASH_FLAG) &&
          spec.precision() <= static_cast<int>(num_digits)) {
        // Octal prefix '0' is counted as a digit, so only add it if precision
        // is not greater than the number of digits.
        prefix[prefix_size++] = '0';
      }
      writer.write_int(num_digits, get_prefix(), spec,
                       bin_writer<3>{abs_value, num_digits});
    }